

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httphandler.cpp
# Opt level: O3

void __thiscall HttpHandler::parseURL(HttpHandler *this,char *request_uri)

{
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var1;
  size_type __len1;
  UriQueryListA *pUVar2;
  wchar_t wVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar4;
  size_t sVar5;
  char *__dest;
  mapped_type *pmVar6;
  UriQueryListA *queryList;
  int itemCount;
  UriParserStateA state;
  UriUriA uri;
  allocator<char> local_141;
  UriQueryListA *local_140;
  key_type local_138;
  wchar_t local_114;
  key_type local_110;
  UriParserStateA_conflict local_f0;
  UriUriA local_d0;
  
  puVar4 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)operator_new(0x38);
  *(undefined8 *)&(puVar4->_M_h)._M_rehash_policy = 0;
  (puVar4->_M_h)._M_rehash_policy._M_next_resize = 0;
  (puVar4->_M_h)._M_buckets = &(puVar4->_M_h)._M_single_bucket;
  (puVar4->_M_h)._M_bucket_count = 1;
  (puVar4->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (puVar4->_M_h)._M_element_count = 0;
  (puVar4->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (puVar4->_M_h)._M_rehash_policy._M_next_resize = 0;
  (puVar4->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  this->parameter = puVar4;
  local_f0.uri = &local_d0;
  if (request_uri != (char *)0x0) {
    wVar3 = uriParseUriA(&local_f0,request_uri);
    if (wVar3 == L'\0') {
      wVar3 = uriDissectQueryMallocA
                        (&local_140,&local_114,local_d0.query.first,local_d0.query.afterLast);
      if (wVar3 != L'\0') {
        return;
      }
      do {
        pUVar2 = local_140;
        if (local_140->value == (char *)0x0) {
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
          p_Var1 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)this->parameter;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,local_140->key,&local_141);
          pmVar6 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](p_Var1,&local_110);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (pmVar6,&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          sVar5 = strlen(local_140->value);
          __dest = (char *)operator_new__(sVar5 + 1);
          strcpy(__dest,pUVar2->value);
          uriUnescapeInPlaceExA(__dest,0,URI_BR_DONT_TOUCH);
          p_Var1 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)this->parameter;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_138,local_140->key,(allocator<char> *)&local_110);
          pmVar6 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](p_Var1,&local_138);
          __len1 = pmVar6->_M_string_length;
          sVar5 = strlen(__dest);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(pmVar6,0,__len1,__dest,sVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          operator_delete__(__dest);
        }
        local_140 = local_140->next;
      } while (local_140 != (UriQueryListA *)0x0);
      uriFreeQueryListA((UriQueryListA *)0x0);
    }
    uriFreeUriMembersA(&local_d0);
  }
  return;
}

Assistant:

void HttpHandler::parseURL(const char *request_uri)
{
    this->parameter = new std::unordered_map<std::string, std::string>();
    UriParserStateA state;
    UriUriA uri;
    state.uri = &uri;

    if (request_uri == nullptr)
    {
        return;
    }

    if (uriParseUriA(&state, request_uri) != URI_SUCCESS)
    {
        uriFreeUriMembersA(&uri);
        return;
    }

    UriQueryListA *queryList;
    int itemCount;

    if (uriDissectQueryMallocA(&queryList, &itemCount, uri.query.first, uri.query.afterLast) == URI_SUCCESS)
    {
        auto &current = queryList;

        do
        {
            if (queryList->value != nullptr)
            {
                auto buffer = new char[std::strlen(queryList->value) + 1];
                std::strcpy(buffer, (char *)queryList->value);

                uriUnescapeInPlaceExA(buffer, false, URI_BR_DONT_TOUCH);
                (*this->parameter)[queryList->key] = buffer;
                delete[] buffer;
            }
            else
            {
                (*this->parameter)[queryList->key] = std::string("");
            }

            current = queryList->next;
        } while (current != nullptr);

        uriFreeQueryListA(queryList);
        uriFreeUriMembersA(&uri);
        return;
    }
}